

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O0

void Bac_ManWriteVar(Bac_Ntk_t *p,int RealName)

{
  Vec_Str_t *p_00;
  char *pStr;
  int RealName_local;
  Bac_Ntk_t *p_local;
  
  p_00 = p->pDesign->vOut;
  pStr = Bac_NtkStr(p,RealName);
  Vec_StrPrintStr(p_00,pStr);
  return;
}

Assistant:

static inline void Bac_ManWriteVar( Bac_Ntk_t * p, int RealName )
{
    Vec_StrPrintStr( p->pDesign->vOut, Bac_NtkStr(p, RealName) );
}